

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
wasm::Builder::makeFunction
          (Name name,vector<wasm::NameType,_std::allocator<wasm::NameType>_> *params,HeapType type,
          vector<wasm::NameType,_std::allocator<wasm::NameType>_> *vars,Expression *body)

{
  mapped_type mVar1;
  iterator __position;
  char *pcVar2;
  HeapTypeKind HVar3;
  undefined8 *__s;
  Type *pTVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  pointer *__ptr;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> _Var7;
  long lVar8;
  key_type *__k;
  ulong uVar9;
  long lVar10;
  Type *__args;
  Type *pTVar11;
  Signature SVar12;
  undefined8 in_stack_00000008;
  HeapType local_60;
  HeapType type_local;
  undefined1 local_40 [8];
  Index index;
  
  _Var7.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = name.super_IString.str._M_len;
  local_60.id = (uintptr_t)vars;
  HVar3 = HeapType::getKind(&local_60);
  if (HVar3 != Func) {
    __assert_fail("type.isSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                  ,0x40,
                  "static std::unique_ptr<Function> wasm::Builder::makeFunction(Name, std::vector<NameType> &&, HeapType, std::vector<NameType> &&, Expression *)"
                 );
  }
  __s = (undefined8 *)operator_new(0x1d8);
  memset(__s,0,0x1d8);
  HeapType::HeapType((HeapType *)(__s + 7),(Signature)ZEXT816(0));
  *(undefined4 *)(__s + 8) = 0;
  __s[9] = 0;
  __s[10] = 0;
  __s[0xb] = 0;
  __s[0xc] = 0;
  __s[0xd] = __s + 0x13;
  __s[0xe] = 1;
  __s[0xf] = 0;
  __s[0x10] = 0;
  *(undefined4 *)(__s + 0x11) = 0x3f800000;
  __s[0x12] = 0;
  __s[0x13] = 0;
  __s[0x14] = __s + 0x1a;
  __s[0x15] = 1;
  __s[0x16] = 0;
  __s[0x17] = 0;
  *(undefined4 *)(__s + 0x18) = 0x3f800000;
  __s[0x19] = 0;
  __s[0x1a] = 0;
  __s[0x1b] = __s + 0x21;
  __s[0x1c] = 1;
  __s[0x1d] = 0;
  __s[0x1e] = 0;
  *(undefined4 *)(__s + 0x1f) = 0x3f800000;
  __s[0x20] = 0;
  __s[0x21] = 0;
  *(undefined1 *)((long)__s + 0x124) = 0;
  *(undefined1 *)((long)__s + 0x13c) = 0;
  __s[0x28] = __s + 0x2e;
  __s[0x29] = 1;
  __s[0x2a] = 0;
  __s[0x2b] = 0;
  *(undefined4 *)(__s + 0x2c) = 0x3f800000;
  __s[0x2d] = 0;
  __s[0x2e] = 0;
  __s[0x2f] = __s + 0x35;
  __s[0x30] = 1;
  __s[0x31] = 0;
  __s[0x32] = 0;
  *(undefined4 *)(__s + 0x33) = 0x3f800000;
  *(undefined8 *)((long)__s + 0x1ac) = 0;
  *(undefined8 *)((long)__s + 0x1b4) = 0;
  __s[0x34] = 0;
  __s[0x35] = 0;
  __s[0x38] = 0;
  __s[0x39] = 0;
  *(undefined2 *)(__s + 0x3a) = 0;
  *(undefined8 **)
   _Var7.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = __s;
  *__s = name.super_IString.str._M_str;
  __s[1] = params;
  __s[7] = local_60.id;
  __s[0xc] = in_stack_00000008;
  lVar8 = *(long *)type.id;
  if (*(long *)(type.id + 8) != lVar8) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      SVar12 = HeapType::getSignature
                         ((HeapType *)
                          (*(long *)_Var7.
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                          0x38));
      type_local.id = (uintptr_t)SVar12.params.id;
      local_40 = (undefined1  [8])&type_local;
      _index = uVar9;
      pTVar4 = wasm::Type::Iterator::operator*((Iterator *)local_40);
      if (pTVar4->id != *(uintptr_t *)(lVar8 + 0x10 + lVar10)) {
        __assert_fail("func->getParams()[i] == param.type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                      ,0x47,
                      "static std::unique_ptr<Function> wasm::Builder::makeFunction(Name, std::vector<NameType> &&, HeapType, std::vector<NameType> &&, Expression *)"
                     );
      }
      __k = (key_type *)(lVar8 + lVar10);
      mVar1 = *(mapped_type *)
               (*(long *)_Var7.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x80);
      local_40._0_4_ = mVar1;
      pmVar5 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(*(long *)_Var7.
                                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                         .super__Head_base<0UL,_wasm::Function_*,_false>.
                                         _M_head_impl + 0xa0),__k);
      *pmVar5 = mVar1;
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(*(long *)_Var7.
                                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                         .super__Head_base<0UL,_wasm::Function_*,_false>.
                                         _M_head_impl + 0x68),(key_type *)local_40);
      pcVar2 = (__k->super_IString).str._M_str;
      (pmVar6->super_IString).str._M_len = (__k->super_IString).str._M_len;
      (pmVar6->super_IString).str._M_str = pcVar2;
      uVar9 = uVar9 + 1;
      lVar8 = *(long *)type.id;
      lVar10 = lVar10 + 0x18;
    } while (uVar9 < (ulong)((*(long *)(type.id + 8) - lVar8 >> 3) * -0x5555555555555555));
  }
  pTVar4 = (Type *)(body->type).id;
  if (*(Type **)body != pTVar4) {
    __args = *(Type **)body + 2;
    do {
      lVar8 = *(long *)_Var7.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      __position._M_current = *(Type **)(lVar8 + 0x50);
      if (__position._M_current == *(Type **)(lVar8 + 0x58)) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)(lVar8 + 0x48),__position,__args
                  );
      }
      else {
        (__position._M_current)->id = __args->id;
        *(Type **)(lVar8 + 0x50) = __position._M_current + 1;
      }
      mVar1 = *(mapped_type *)
               (*(long *)_Var7.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x80);
      local_40._0_4_ = mVar1;
      pmVar5 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(*(long *)_Var7.
                                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                         .super__Head_base<0UL,_wasm::Function_*,_false>.
                                         _M_head_impl + 0xa0),(key_type *)(__args + -2));
      *pmVar5 = mVar1;
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(*(long *)_Var7.
                                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                         .super__Head_base<0UL,_wasm::Function_*,_false>.
                                         _M_head_impl + 0x68),(key_type *)local_40);
      pcVar2 = (char *)__args[-1].id;
      (pmVar6->super_IString).str._M_len = (((key_type *)(__args + -2))->super_IString).str._M_len;
      (pmVar6->super_IString).str._M_str = pcVar2;
      pTVar11 = __args + 1;
      __args = __args + 3;
    } while (pTVar11 != pTVar4);
  }
  return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
         _Var7.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<Function> makeFunction(Name name,
                                                std::vector<NameType>&& params,
                                                HeapType type,
                                                std::vector<NameType>&& vars,
                                                Expression* body = nullptr) {
    assert(type.isSignature());
    auto func = std::make_unique<Function>();
    func->name = name;
    func->type = type;
    func->body = body;
    for (size_t i = 0; i < params.size(); ++i) {
      NameType& param = params[i];
      assert(func->getParams()[i] == param.type);
      Index index = func->localNames.size();
      func->localIndices[param.name] = index;
      func->localNames[index] = param.name;
    }
    for (auto& var : vars) {
      func->vars.push_back(var.type);
      Index index = func->localNames.size();
      func->localIndices[var.name] = index;
      func->localNames[index] = var.name;
    }
    return func;
  }